

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

void __thiscall embree::FastAllocator::Block::print_block(Block *this)

{
  ostream *poVar1;
  
  if ((ulong)this->atype < 3) {
    std::operator<<((ostream *)&std::cout,
                    &DAT_01f51210 + *(int *)(&DAT_01f51210 + (ulong)this->atype * 4));
  }
  if (this->huge_pages == true) {
    std::operator<<((ostream *)&std::cout,"H");
  }
  getBlockFreeBytes(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"] ");
  return;
}

Assistant:

void print_block() const
      {
        if (atype == ALIGNED_MALLOC) std::cout << "A";
        else if (atype == EMBREE_OS_MALLOC) std::cout << "O";
        else if (atype == SHARED) std::cout << "S";
        if (huge_pages) std::cout << "H";
        size_t bytesUsed = getBlockUsedBytes();
        size_t bytesFree = getBlockFreeBytes();
        size_t bytesWasted = getBlockWastedBytes();
        std::cout << "[" << bytesUsed << ", " << bytesFree << ", " << bytesWasted << "] ";
      }